

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<float>::UpdateFrom
          (TPZBlockDiagonal<float> *this,TPZAutoPointer<TPZMatrix<float>_> *mat)

{
  bool bVar1;
  ostream *poVar2;
  int64_t iVar3;
  int *piVar4;
  long lVar5;
  long *plVar6;
  TPZMatrix<float> *pTVar7;
  TPZAutoPointer *in_RSI;
  long in_RDI;
  TPZFMatrix<float> block;
  int64_t firsteq;
  int64_t pos;
  int64_t bsize;
  int64_t b;
  int64_t nblock;
  undefined1 local_c8 [8];
  int64_t in_stack_ffffffffffffff40;
  float *in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  TPZFMatrix<float> *in_stack_ffffffffffffff60;
  long local_38;
  int64_t local_20;
  
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x18) = 0;
    iVar3 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
    local_38 = 0;
    for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_20);
      lVar5 = (long)*piVar4;
      plVar6 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_20);
      TPZVec<float>::operator[]((TPZVec<float> *)(in_RDI + 0x20),*plVar6);
      TPZFMatrix<float>::TPZFMatrix
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      pTVar7 = TPZAutoPointer<TPZMatrix<float>_>::operator->
                         ((TPZAutoPointer<TPZMatrix<float>_> *)in_RSI);
      (*(pTVar7->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x2f])
                (pTVar7,local_38,local_38,lVar5,lVar5,local_c8);
      local_38 = lVar5 + local_38;
      TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x11e8ee5);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"TPZBlockDiagonal::UpdateFrom");
    std::operator<<(poVar2," called with zero argument\n");
  }
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
	if(!mat) 
	{
		cout << "TPZBlockDiagonal::UpdateFrom" << " called with zero argument\n";
		return;
	}
	this->fDecomposed = ENoDecompose;
	int64_t nblock = fBlockSize.NElements();
	int64_t b,bsize,pos,firsteq = 0;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		//    int r,c;
		pos = fBlockPos[b];
		TPZFMatrix<TVar> block(bsize,bsize,&fStorage[pos],bsize*bsize);
		mat->GetSub(firsteq,firsteq,bsize,bsize,block);
		firsteq += bsize;
	}
}